

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O1

void cfl_predict_lbd_32x32_avx2(int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  byte bVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  
  auVar7._0_2_ = (undefined2)alpha_q3;
  auVar7._2_2_ = auVar7._0_2_;
  auVar7._4_2_ = auVar7._0_2_;
  auVar7._6_2_ = auVar7._0_2_;
  auVar7._8_2_ = auVar7._0_2_;
  auVar7._10_2_ = auVar7._0_2_;
  auVar7._12_2_ = auVar7._0_2_;
  auVar7._14_2_ = auVar7._0_2_;
  auVar7._16_2_ = auVar7._0_2_;
  auVar7._18_2_ = auVar7._0_2_;
  auVar7._20_2_ = auVar7._0_2_;
  auVar7._22_2_ = auVar7._0_2_;
  auVar7._24_2_ = auVar7._0_2_;
  auVar7._26_2_ = auVar7._0_2_;
  auVar7._28_2_ = auVar7._0_2_;
  auVar7._30_2_ = auVar7._0_2_;
  auVar8 = vpabsw_avx2(auVar7);
  auVar8 = vpsllw_avx2(auVar8,9);
  bVar3 = *dst;
  auVar9[1] = 0;
  auVar9[0] = bVar3;
  auVar9[2] = bVar3;
  auVar9[3] = 0;
  auVar9[4] = bVar3;
  auVar9[5] = 0;
  auVar9[6] = bVar3;
  auVar9[7] = 0;
  auVar9[8] = bVar3;
  auVar9[9] = 0;
  auVar9[10] = bVar3;
  auVar9[0xb] = 0;
  auVar9[0xc] = bVar3;
  auVar9[0xd] = 0;
  auVar9[0xe] = bVar3;
  auVar9[0xf] = 0;
  auVar9[0x10] = bVar3;
  auVar9[0x11] = 0;
  auVar9[0x12] = bVar3;
  auVar9[0x13] = 0;
  auVar9[0x14] = bVar3;
  auVar9[0x15] = 0;
  auVar9[0x16] = bVar3;
  auVar9[0x17] = 0;
  auVar9[0x18] = bVar3;
  auVar9[0x19] = 0;
  auVar9[0x1a] = bVar3;
  auVar9[0x1b] = 0;
  auVar9[0x1c] = bVar3;
  auVar9[0x1d] = 0;
  auVar9[0x1e] = bVar3;
  auVar9[0x1f] = 0;
  uVar6 = 0xffffffffffffffc0;
  do {
    auVar1 = *(undefined1 (*) [32])((long)pred_buf_q3 + uVar6 + 0x40);
    auVar2 = *(undefined1 (*) [32])((long)pred_buf_q3 + uVar6 + 0x60);
    auVar4 = vpsignw_avx2(auVar7,auVar1);
    auVar1 = vpabsw_avx2(auVar1);
    auVar1 = vpmulhrsw_avx2(auVar1,auVar8);
    auVar1 = vpsignw_avx2(auVar1,auVar4);
    auVar4 = vpaddw_avx2(auVar1,auVar9);
    auVar5 = vpsignw_avx2(auVar7,auVar2);
    auVar1 = vpabsw_avx2(auVar2);
    auVar1 = vpmulhrsw_avx2(auVar1,auVar8);
    auVar1 = vpsignw_avx2(auVar1,auVar5);
    auVar1 = vpaddw_avx2(auVar1,auVar9);
    auVar1 = vpackuswb_avx2(auVar4,auVar1);
    auVar1 = vpermq_avx2(auVar1,0xd8);
    *(undefined1 (*) [32])dst = auVar1;
    dst = *(undefined1 (*) [32])dst + dst_stride;
    uVar6 = uVar6 + 0x40;
  } while (uVar6 < 0x7c0);
  return;
}

Assistant:

static inline void cfl_predict_lbd_avx2(const int16_t *pred_buf_q3,
                                        uint8_t *dst, int dst_stride,
                                        int alpha_q3, int width, int height) {
  (void)width;
  const __m256i alpha_sign = _mm256_set1_epi16(alpha_q3);
  const __m256i alpha_q12 = _mm256_slli_epi16(_mm256_abs_epi16(alpha_sign), 9);
  const __m256i dc_q0 = _mm256_set1_epi16(*dst);
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;

  do {
    __m256i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    __m256i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
    res = _mm256_packus_epi16(res, next);
    res = _mm256_permute4x64_epi64(res, _MM_SHUFFLE(3, 1, 2, 0));
    _mm256_storeu_si256((__m256i *)dst, res);
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}